

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void event_queue_remove_timeout(event_base *base,event *ev)

{
  short *psVar1;
  ushort uVar2;
  uint uVar3;
  event *peVar4;
  event **ppeVar5;
  event *peVar6;
  long lVar7;
  long lVar8;
  event *peVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  bool bVar17;
  bool bVar18;
  ulong uVar16;
  
  if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar11 = evthread_is_debug_lock_held_(base->th_base_lock), iVar11 == 0)) {
LAB_001efadd:
    event_queue_remove_timeout_cold_2();
  }
  uVar2 = (ev->ev_evcallback).evcb_flags;
  if ((uVar2 & 1) == 0) {
    event_queue_remove_timeout_cold_1();
    goto LAB_001efadd;
  }
  base->event_count = base->event_count - (uint)((uVar2 & 0x10) == 0);
  psVar1 = &(ev->ev_evcallback).evcb_flags;
  *(byte *)psVar1 = (byte)*psVar1 & 0xfe;
  uVar16 = (ev->ev_timeout).tv_usec;
  if ((((uint)uVar16 & 0xf0000000) == 0x50000000) &&
     ((int)((uint)(uVar16 >> 0x14) & 0xff) < base->n_common_timeouts)) {
    peVar4 = (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
    if (peVar4 == (event *)0x0) {
      *(event ***)
       (*(long *)((long)base->common_timeout_queues + (ulong)((uint)(uVar16 >> 0x11) & 0x7f8)) + 8)
           = (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev;
    }
    else {
      (peVar4->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev =
           (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev;
    }
    *(ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev =
         (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
    return;
  }
  if ((ev->ev_timeout_pos).min_heap_idx == -1) {
    return;
  }
  ppeVar5 = (base->timeheap).p;
  uVar15 = (base->timeheap).n - 1;
  uVar16 = (ulong)uVar15;
  (base->timeheap).n = uVar15;
  peVar4 = ppeVar5[uVar16];
  uVar12 = (ev->ev_timeout_pos).min_heap_idx;
  if (0 < (int)uVar12) {
    peVar6 = ppeVar5[(uint)((int)((uVar12 - ((int)(uVar12 - 1) >> 0x1f)) + -1) >> 1)];
    lVar7 = (peVar4->ev_timeout).tv_sec;
    lVar8 = (peVar6->ev_timeout).tv_sec;
    bVar18 = SBORROW8(lVar8,lVar7);
    lVar10 = lVar8 - lVar7;
    bVar17 = lVar8 == lVar7;
    if (bVar17) {
      lVar7 = (peVar6->ev_timeout).tv_usec;
      lVar8 = (peVar4->ev_timeout).tv_usec;
      bVar18 = SBORROW8(lVar7,lVar8);
      lVar10 = lVar7 - lVar8;
      bVar17 = lVar7 == lVar8;
    }
    if (!bVar17 && bVar18 == lVar10 < 0) {
      uVar14 = uVar12 - 1 >> 1;
      do {
        uVar15 = uVar14;
        ppeVar5 = (base->timeheap).p;
        uVar13 = (ulong)uVar15;
        peVar6 = ppeVar5[uVar13];
        ppeVar5[uVar12] = peVar6;
        (peVar6->ev_timeout_pos).min_heap_idx = uVar12;
        if (uVar15 == 0) break;
        uVar14 = uVar15 - 1 >> 1;
        peVar6 = (base->timeheap).p[uVar14];
        lVar7 = (peVar4->ev_timeout).tv_sec;
        lVar8 = (peVar6->ev_timeout).tv_sec;
        bVar18 = SBORROW8(lVar8,lVar7);
        lVar10 = lVar8 - lVar7;
        bVar17 = lVar8 == lVar7;
        if (bVar17) {
          lVar7 = (peVar6->ev_timeout).tv_usec;
          lVar8 = (peVar4->ev_timeout).tv_usec;
          bVar18 = SBORROW8(lVar7,lVar8);
          lVar10 = lVar7 - lVar8;
          bVar17 = lVar7 == lVar8;
        }
        uVar12 = uVar15;
      } while (!bVar17 && bVar18 == lVar10 < 0);
      goto LAB_001efa8d;
    }
  }
  uVar14 = uVar12 * 2 + 2;
  if (uVar15 < uVar14) {
LAB_001efa08:
    uVar13 = (ulong)uVar12;
  }
  else {
    do {
      iVar11 = -1;
      if (uVar14 != (uint)uVar16) {
        ppeVar5 = (base->timeheap).p;
        peVar6 = ppeVar5[uVar14];
        peVar9 = ppeVar5[(ulong)(uVar12 * 2) + 1];
        lVar7 = (peVar9->ev_timeout).tv_sec;
        lVar8 = (peVar6->ev_timeout).tv_sec;
        bVar18 = SBORROW8(lVar8,lVar7);
        lVar10 = lVar8 - lVar7;
        bVar17 = lVar8 == lVar7;
        if (bVar17) {
          lVar7 = (peVar6->ev_timeout).tv_usec;
          lVar8 = (peVar9->ev_timeout).tv_usec;
          bVar18 = SBORROW8(lVar7,lVar8);
          lVar10 = lVar7 - lVar8;
          bVar17 = lVar7 == lVar8;
        }
        iVar11 = -(uint)(!bVar17 && bVar18 == lVar10 < 0);
      }
      uVar15 = iVar11 + uVar14;
      uVar13 = (ulong)uVar15;
      ppeVar5 = (base->timeheap).p;
      peVar6 = ppeVar5[uVar13];
      lVar7 = (peVar6->ev_timeout).tv_sec;
      lVar8 = (peVar4->ev_timeout).tv_sec;
      bVar18 = SBORROW8(lVar8,lVar7);
      lVar10 = lVar8 - lVar7;
      bVar17 = lVar8 == lVar7;
      if (bVar17) {
        lVar7 = (peVar4->ev_timeout).tv_usec;
        lVar8 = (peVar6->ev_timeout).tv_usec;
        bVar18 = SBORROW8(lVar7,lVar8);
        lVar10 = lVar7 - lVar8;
        bVar17 = lVar7 == lVar8;
      }
      if (bVar17 || bVar18 != lVar10 < 0) goto LAB_001efa08;
      ppeVar5[uVar12] = peVar6;
      (peVar6->ev_timeout_pos).min_heap_idx = uVar12;
      uVar14 = uVar15 * 2 + 2;
      uVar3 = (base->timeheap).n;
      uVar16 = (ulong)uVar3;
      uVar12 = uVar15;
    } while (uVar14 <= uVar3);
  }
  uVar15 = (uint)uVar13;
LAB_001efa8d:
  (base->timeheap).p[uVar13] = peVar4;
  (peVar4->ev_timeout_pos).min_heap_idx = uVar15;
  (ev->ev_timeout_pos).min_heap_idx = -1;
  return;
}

Assistant:

static void
event_queue_remove_timeout(struct event_base *base, struct event *ev)
{
	EVENT_BASE_ASSERT_LOCKED(base);
	if (EVUTIL_FAILURE_CHECK(!(ev->ev_flags & EVLIST_TIMEOUT))) {
		event_errx(1, "%s: %p(fd "EV_SOCK_FMT") not on queue %x", __func__,
		    ev, EV_SOCK_ARG(ev->ev_fd), EVLIST_TIMEOUT);
		return;
	}
	DECR_EVENT_COUNT(base, ev->ev_flags);
	ev->ev_flags &= ~EVLIST_TIMEOUT;

	if (is_common_timeout(&ev->ev_timeout, base)) {
		struct common_timeout_list *ctl =
		    get_common_timeout_list(base, &ev->ev_timeout);
		TAILQ_REMOVE(&ctl->events, ev,
		    ev_timeout_pos.ev_next_with_common_timeout);
	} else {
		min_heap_erase_(&base->timeheap, ev);
	}
}